

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-job.cc
# Opt level: O0

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "This program linearizes the first page of in.pdf to out1.pdf, out2.pdf, and"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           " out3.pdf, each demonstrating a different way to use the QPDFJob API");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

static void
usage()
{
    std::cerr << "Usage: " << whoami << std::endl
              << "This program linearizes the first page of in.pdf to out1.pdf, out2.pdf, and"
              << std::endl
              << " out3.pdf, each demonstrating a different way to use the QPDFJob API"
              << std::endl;
    exit(2);
}